

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall
kj::ExceptionCallback::RootExceptionCallback::onRecoverableException
          (RootExceptionCallback *this,Exception *exception)

{
  ulong uVar1;
  ExceptionImpl *this_00;
  Exception *pEVar2;
  Exception *exception_local;
  RootExceptionCallback *this_local;
  
  uVar1 = std::uncaught_exception();
  if ((uVar1 & 1) == 0) {
    this_00 = (ExceptionImpl *)__cxa_allocate_exception(0x178);
    pEVar2 = mv<kj::Exception>(exception);
    ExceptionImpl::ExceptionImpl(this_00,pEVar2);
    __cxa_throw(this_00,&ExceptionImpl::typeinfo,ExceptionImpl::~ExceptionImpl);
  }
  pEVar2 = mv<kj::Exception>(exception);
  logException(this,ERROR,pEVar2);
  return;
}

Assistant:

void onRecoverableException(Exception&& exception) override {
#if KJ_NO_EXCEPTIONS
    logException(LogSeverity::ERROR, mv(exception));
#else
    if (std::uncaught_exception()) {
      // Bad time to throw an exception.  Just log instead.
      //
      // TODO(someday): We should really compare uncaughtExceptionCount() against the count at
      //   the innermost runCatchingExceptions() frame in this thread to tell if exceptions are
      //   being caught correctly.
      logException(LogSeverity::ERROR, mv(exception));
    } else {
      throw ExceptionImpl(mv(exception));
    }
#endif
  }